

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O3

int __thiscall
QKeySequenceEditPrivate::translateModifiers
          (QKeySequenceEditPrivate *this,KeyboardModifiers state,QString *text)

{
  return (uint)state.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i & 0x1c000000;
}

Assistant:

int QKeySequenceEditPrivate::translateModifiers(Qt::KeyboardModifiers state, const QString &text)
{
    Q_UNUSED(text);
    int result = 0;
    if (state & Qt::ControlModifier)
        result |= Qt::CTRL;
    if (state & Qt::MetaModifier)
        result |= Qt::META;
    if (state & Qt::AltModifier)
        result |= Qt::ALT;
    return result;
}